

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::drawElementsIndirect
          (ReferenceContext *this,deUint32 mode,deUint32 type,void *indirect)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  DataBuffer *pDVar4;
  deUint8 *pdVar5;
  uint *puVar6;
  int local_54;
  void *indicesPtr;
  size_t sizeOfType;
  DrawElementsIndirectCommand *command;
  void *indirect_local;
  deUint32 type_local;
  deUint32 mode_local;
  ReferenceContext *this_local;
  
  bVar1 = predrawErrorChecks(this,mode);
  if (bVar1) {
    do {
      if (((type != 0x1401) && (type != 0x1403)) && (type != 0x1405)) {
        setError(this,0x500);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      pDVar4 = getBufferBinding(this,0x8893);
      if (pDVar4 == (DataBuffer *)0x0) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      if (this->m_drawIndirectBufferBinding == (DataBuffer *)0x0) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = deIsAlignedPtr(indirect,4);
      if (dVar2 == 0) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = rc::DataBuffer::getSize(this->m_drawIndirectBufferBinding);
      if ((void *)(long)iVar3 < indirect) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = rc::DataBuffer::getSize(this->m_drawIndirectBufferBinding);
      if ((ulong)(long)iVar3 < (long)indirect + 0x14U) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pdVar5 = rc::DataBuffer::getData(this->m_drawIndirectBufferBinding);
    puVar6 = (uint *)(pdVar5 + (long)indirect);
    do {
      if (puVar6[4] != 0) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      if (((int)*puVar6 < 0) || ((int)puVar6[1] < 0)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (type == 0x1401) {
      local_54 = 1;
    }
    else {
      local_54 = 4;
      if (type == 0x1403) {
        local_54 = 2;
      }
    }
    (*(this->super_Context)._vptr_Context[0x6d])
              (this,(ulong)mode,(ulong)*puVar6,(ulong)type,(ulong)puVar6[2] * (long)local_54,
               (ulong)puVar6[1],puVar6[3]);
  }
  return;
}

Assistant:

void ReferenceContext::drawElementsIndirect	(deUint32 mode, deUint32 type, const void *indirect)
{
	struct DrawElementsIndirectCommand
	{
		deUint32 count;
		deUint32 primCount;
		deUint32 firstIndex;
		deInt32  baseVertex;
		deUint32 reservedMustBeZero;
	};

	const DrawElementsIndirectCommand* command;

	// Check errors

	if (!predrawErrorChecks(mode))
		return;

	RC_IF_ERROR(type != GL_UNSIGNED_BYTE &&
				type != GL_UNSIGNED_SHORT &&
				type != GL_UNSIGNED_INT, GL_INVALID_ENUM, RC_RET_VOID);

	RC_IF_ERROR(!getBufferBinding(GL_ELEMENT_ARRAY_BUFFER), GL_INVALID_OPERATION, RC_RET_VOID);

	// Check pointer validity

	RC_IF_ERROR(m_drawIndirectBufferBinding == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(!deIsAlignedPtr(indirect, 4), GL_INVALID_OPERATION, RC_RET_VOID);

	// \note watch for overflows, indirect might be close to 0xFFFFFFFF and indirect+something might overflow
	RC_IF_ERROR((size_t)((const char*)indirect - (const char*)DE_NULL)                                       > (size_t)m_drawIndirectBufferBinding->getSize(), GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR((size_t)((const char*)indirect - (const char*)DE_NULL) + sizeof(DrawElementsIndirectCommand) > (size_t)m_drawIndirectBufferBinding->getSize(), GL_INVALID_OPERATION, RC_RET_VOID);

	// Check values

	command = (const DrawElementsIndirectCommand*)(m_drawIndirectBufferBinding->getData() + ((const char*)indirect - (const char*)DE_NULL));
	RC_IF_ERROR(command->reservedMustBeZero != 0, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check command error conditions
	RC_IF_ERROR((int)command->count < 0 || (int)command->primCount < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// Draw
	{
		const size_t			sizeOfType		= (type == GL_UNSIGNED_BYTE) ?  (1) : ((type == GL_UNSIGNED_SHORT) ? (2) : (4));
		const void*				indicesPtr		= (deUint8*)DE_NULL + (command->firstIndex * sizeOfType);

		drawElementsInstancedBaseVertex(mode, (int)command->count, type, indicesPtr, (int)command->primCount, command->baseVertex);
	}
}